

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Int64ToDoubleMap * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::Int64ToDoubleMap>(Arena *this)

{
  Int64ToDoubleMap *this_00;
  
  this_00 = (Int64ToDoubleMap *)
            AllocateAlignedWithHook
                      (this,0x48,(type_info *)&CoreML::Specification::Int64ToDoubleMap::typeinfo);
  CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap(this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }